

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strtod.h
# Opt level: O0

double rapidjson::internal::StrtodFullPrecision
                 (double d,int p,char *decimals,size_t length,size_t decimalPosition,int exp)

{
  bool bVar1;
  uint uVar2;
  int delta;
  int kMaxDecimalDigit;
  double result;
  size_t sStack_38;
  int exp_local;
  size_t decimalPosition_local;
  size_t length_local;
  char *decimals_local;
  double dStack_18;
  int p_local;
  double d_local;
  
  result._4_4_ = exp;
  sStack_38 = decimalPosition;
  decimalPosition_local = length;
  length_local = (size_t)decimals;
  decimals_local._4_4_ = p;
  dStack_18 = d;
  if (d < 0.0) {
    __assert_fail("d >= 0.0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/rapidjson/internal/strtod.h"
                  ,0xe1,
                  "double rapidjson::internal::StrtodFullPrecision(double, int, const char *, size_t, size_t, int)"
                 );
  }
  if (length != 0) {
    bVar1 = StrtodFast(d,p,(double *)&delta);
    if (bVar1) {
      d_local = _delta;
    }
    else {
      for (; *(char *)length_local == '0' && 1 < decimalPosition_local;
          length_local = length_local + 1) {
        decimalPosition_local = decimalPosition_local - 1;
        sStack_38 = sStack_38 - 1;
      }
      for (; *(char *)(length_local + (decimalPosition_local - 1)) == '0' &&
             1 < decimalPosition_local; decimalPosition_local = decimalPosition_local - 1) {
        sStack_38 = sStack_38 - 1;
        result._4_4_ = result._4_4_ + 1;
      }
      if (0x30c < (int)decimalPosition_local) {
        uVar2 = (int)decimalPosition_local - 0x30c;
        result._4_4_ = uVar2 + result._4_4_;
        sStack_38 = sStack_38 - uVar2;
        decimalPosition_local = 0x30c;
      }
      if ((int)decimalPosition_local + result._4_4_ < -0x144) {
        d_local = 0.0;
      }
      else {
        bVar1 = StrtodDiyFp((char *)length_local,decimalPosition_local,sStack_38,result._4_4_,
                            (double *)&delta);
        if (bVar1) {
          d_local = _delta;
        }
        else {
          d_local = StrtodBigInteger(_delta,(char *)length_local,decimalPosition_local,sStack_38,
                                     result._4_4_);
        }
      }
    }
    return d_local;
  }
  __assert_fail("length >= 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/rapidjson/internal/strtod.h"
                ,0xe2,
                "double rapidjson::internal::StrtodFullPrecision(double, int, const char *, size_t, size_t, int)"
               );
}

Assistant:

inline double StrtodFullPrecision(double d, int p, const char* decimals, size_t length, size_t decimalPosition, int exp) {
    RAPIDJSON_ASSERT(d >= 0.0);
    RAPIDJSON_ASSERT(length >= 1);

    double result;
    if (StrtodFast(d, p, &result))
        return result;

    // Trim leading zeros
    while (*decimals == '0' && length > 1) {
        length--;
        decimals++;
        decimalPosition--;
    }

    // Trim trailing zeros
    while (decimals[length - 1] == '0' && length > 1) {
        length--;
        decimalPosition--;
        exp++;
    }

    // Trim right-most digits
    const int kMaxDecimalDigit = 780;
    if (static_cast<int>(length) > kMaxDecimalDigit) {
        int delta = (static_cast<int>(length) - kMaxDecimalDigit);
        exp += delta;
        decimalPosition -= static_cast<unsigned>(delta);
        length = kMaxDecimalDigit;
    }

    // If too small, underflow to zero
    if (int(length) + exp < -324)
        return 0.0;

    if (StrtodDiyFp(decimals, length, decimalPosition, exp, &result))
        return result;

    // Use approximation from StrtodDiyFp and make adjustment with BigInteger comparison
    return StrtodBigInteger(result, decimals, length, decimalPosition, exp);
}